

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_writer_init(mz_zip_archive *pZip,mz_uint64 existing_size)

{
  code *pcVar1;
  mz_zip_internal_state *__s;
  mz_bool mVar2;
  mz_bool mVar3;
  
  mVar2 = 0;
  mVar3 = 0;
  if ((((pZip != (mz_zip_archive *)0x0) &&
       (mVar3 = mVar2, pZip->m_pState == (mz_zip_internal_state *)0x0)) &&
      (pZip->m_pWrite != (mz_file_write_func)0x0)) &&
     ((pZip->m_zip_mode == MZ_ZIP_MODE_INVALID &&
      ((pZip->m_file_offset_alignment & pZip->m_file_offset_alignment - 1) == 0)))) {
    pcVar1 = pZip->m_pAlloc;
    if (pcVar1 == (mz_alloc_func)0x0) {
      pcVar1 = def_alloc_func;
      pZip->m_pAlloc = def_alloc_func;
    }
    if (pZip->m_pFree == (mz_free_func)0x0) {
      pZip->m_pFree = def_free_func;
    }
    if (pZip->m_pRealloc == (mz_realloc_func)0x0) {
      pZip->m_pRealloc = def_realloc_func;
    }
    pZip->m_archive_size = existing_size;
    pZip->m_central_directory_file_ofs = 0;
    pZip->m_total_files = 0;
    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
    __s = (mz_zip_internal_state *)(*pcVar1)(pZip->m_pAlloc_opaque,1,0x98);
    pZip->m_pState = __s;
    if (__s != (mz_zip_internal_state *)0x0) {
      memset(__s,0,0x98);
      (pZip->m_pState->m_central_dir).m_element_size = 1;
      (pZip->m_pState->m_central_dir_offsets).m_element_size = 4;
      (pZip->m_pState->m_sorted_central_dir_offsets).m_element_size = 4;
      mVar3 = 1;
    }
  }
  return mVar3;
}

Assistant:

mz_bool mz_zip_writer_init(mz_zip_archive *pZip, mz_uint64 existing_size) {
  if ((!pZip) || (pZip->m_pState) || (!pZip->m_pWrite) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID))
    return MZ_FALSE;

  if (pZip->m_file_offset_alignment) {
    // Ensure user specified file offset alignment is a power of 2.
    if (pZip->m_file_offset_alignment & (pZip->m_file_offset_alignment - 1))
      return MZ_FALSE;
  }

  if (!pZip->m_pAlloc)
    pZip->m_pAlloc = def_alloc_func;
  if (!pZip->m_pFree)
    pZip->m_pFree = def_free_func;
  if (!pZip->m_pRealloc)
    pZip->m_pRealloc = def_realloc_func;

  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
  pZip->m_archive_size = existing_size;
  pZip->m_central_directory_file_ofs = 0;
  pZip->m_total_files = 0;

  if (NULL == (pZip->m_pState = (mz_zip_internal_state *)pZip->m_pAlloc(
                   pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_internal_state))))
    return MZ_FALSE;
  memset(pZip->m_pState, 0, sizeof(mz_zip_internal_state));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir,
                                sizeof(mz_uint8));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir_offsets,
                                sizeof(mz_uint32));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_sorted_central_dir_offsets,
                                sizeof(mz_uint32));
  return MZ_TRUE;
}